

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerReflection::emit_entry_points(CompilerReflection *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  EntryPoint *pEVar4;
  EntryPoint *pEVar5;
  element_type *peVar6;
  SPIREntryPoint *pSVar7;
  ExecutionModel model;
  uint32_t local_370;
  uint32_t local_358;
  uint32_t local_340;
  TypedID<(spirv_cross::Types)0> local_2b0;
  TypedID<(spirv_cross::Types)0> local_2ac;
  TypedID<(spirv_cross::Types)0> local_2a8;
  allocator local_2a1;
  string local_2a0;
  TypedID<(spirv_cross::Types)0> local_280;
  TypedID<(spirv_cross::Types)0> local_27c;
  TypedID<(spirv_cross::Types)0> local_278;
  allocator local_271;
  string local_270;
  SpecializationConstant local_250;
  SpecializationConstant spec_z;
  SpecializationConstant spec_y;
  SpecializationConstant spec_x;
  SPIREntryPoint *spv_entry;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  EntryPoint *local_1c0;
  EntryPoint *e;
  EntryPoint *__end2;
  EntryPoint *__begin2;
  SmallVector<spirv_cross::EntryPoint,_8UL> *__range2;
  string local_198;
  undefined1 local_168 [8];
  SmallVector<spirv_cross::EntryPoint,_8UL> entries;
  CompilerReflection *this_local;
  
  entries.stack_storage.aligned_char._312_8_ = this;
  Compiler::get_entry_points_and_stages
            ((SmallVector<spirv_cross::EntryPoint,_8UL> *)local_168,(Compiler *)this);
  bVar1 = VectorView<spirv_cross::EntryPoint>::empty
                    ((VectorView<spirv_cross::EntryPoint> *)local_168);
  if (!bVar1) {
    pEVar4 = ::std::begin<spirv_cross::SmallVector<spirv_cross::EntryPoint,8ul>>
                       ((SmallVector<spirv_cross::EntryPoint,_8UL> *)local_168);
    pEVar5 = ::std::end<spirv_cross::SmallVector<spirv_cross::EntryPoint,8ul>>
                       ((SmallVector<spirv_cross::EntryPoint,_8UL> *)local_168);
    ::std::sort<spirv_cross::EntryPoint*,spirv_cross::CompilerReflection::emit_entry_points()::__0>
              (pEVar4,pEVar5);
    peVar6 = ::std::
             __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_198,"entryPoints",(allocator *)((long)&__range2 + 7));
    simple_json::Stream::emit_json_key_array(peVar6,&local_198);
    ::std::__cxx11::string::~string((string *)&local_198);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __begin2 = (EntryPoint *)local_168;
    __end2 = VectorView<spirv_cross::EntryPoint>::begin
                       ((VectorView<spirv_cross::EntryPoint> *)__begin2);
    e = VectorView<spirv_cross::EntryPoint>::end((VectorView<spirv_cross::EntryPoint> *)__begin2);
    for (; __end2 != e; __end2 = __end2 + 1) {
      local_1c0 = __end2;
      peVar6 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      simple_json::Stream::begin_json_object(peVar6);
      peVar6 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1e0,"name",&local_1e1);
      simple_json::Stream::emit_json_key_value(peVar6,&local_1e0,&local_1c0->name);
      ::std::__cxx11::string::~string((string *)&local_1e0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      peVar6 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_208,"mode",&local_209);
      execution_model_to_str_abi_cxx11_
                ((string *)&spv_entry,(CompilerReflection *)(ulong)local_1c0->execution_model,model)
      ;
      simple_json::Stream::emit_json_key_value(peVar6,&local_208,(string *)&spv_entry);
      ::std::__cxx11::string::~string((string *)&spv_entry);
      ::std::__cxx11::string::~string((string *)&local_208);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_209);
      if (local_1c0->execution_model == ExecutionModelGLCompute) {
        pSVar7 = Compiler::get_entry_point
                           ((Compiler *)this,&local_1c0->name,local_1c0->execution_model);
        SpecializationConstant::SpecializationConstant(&spec_y);
        SpecializationConstant::SpecializationConstant(&spec_z);
        SpecializationConstant::SpecializationConstant(&local_250);
        Compiler::get_work_group_size_specialization_constants
                  ((Compiler *)this,&spec_y,&spec_z,&local_250);
        peVar6 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_270,"workgroup_size",&local_271);
        simple_json::Stream::emit_json_key_array(peVar6,&local_270);
        ::std::__cxx11::string::~string((string *)&local_270);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_271);
        peVar6 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&spec_y);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_278,0);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_278);
        if (uVar2 == uVar3) {
          local_340 = (pSVar7->workgroup_size).x;
        }
        else {
          local_340 = spec_y.constant_id;
        }
        simple_json::Stream::emit_json_array_value(peVar6,local_340);
        peVar6 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&spec_z);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_27c,0);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_27c);
        if (uVar2 == uVar3) {
          local_358 = (pSVar7->workgroup_size).y;
        }
        else {
          local_358 = spec_z.constant_id;
        }
        simple_json::Stream::emit_json_array_value(peVar6,local_358);
        peVar6 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_250);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_280,0);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_280);
        if (uVar2 == uVar3) {
          local_370 = (pSVar7->workgroup_size).z;
        }
        else {
          local_370 = local_250.constant_id;
        }
        simple_json::Stream::emit_json_array_value(peVar6,local_370);
        peVar6 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        simple_json::Stream::end_json_array(peVar6);
        peVar6 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_2a0,"workgroup_size_is_spec_constant_id",&local_2a1);
        simple_json::Stream::emit_json_key_array(peVar6,&local_2a0);
        ::std::__cxx11::string::~string((string *)&local_2a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
        peVar6 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&spec_y);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_2a8,0);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2a8);
        simple_json::Stream::emit_json_array_value(peVar6,uVar2 != uVar3);
        peVar6 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&spec_z);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_2ac,0);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2ac);
        simple_json::Stream::emit_json_array_value(peVar6,uVar2 != uVar3);
        peVar6 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_250);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_2b0,0);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2b0);
        simple_json::Stream::emit_json_array_value(peVar6,uVar2 != uVar3);
        peVar6 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        simple_json::Stream::end_json_array(peVar6);
      }
      peVar6 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      simple_json::Stream::end_json_object(peVar6);
    }
    peVar6 = ::std::
             __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
    simple_json::Stream::end_json_array(peVar6);
  }
  SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector
            ((SmallVector<spirv_cross::EntryPoint,_8UL> *)local_168);
  return;
}

Assistant:

void CompilerReflection::emit_entry_points()
{
	auto entries = get_entry_points_and_stages();
	if (!entries.empty())
	{
		// Needed to make output deterministic.
		sort(begin(entries), end(entries), [](const EntryPoint &a, const EntryPoint &b) -> bool {
			if (a.execution_model < b.execution_model)
				return true;
			else if (a.execution_model > b.execution_model)
				return false;
			else
				return a.name < b.name;
		});

		json_stream->emit_json_key_array("entryPoints");
		for (auto &e : entries)
		{
			json_stream->begin_json_object();
			json_stream->emit_json_key_value("name", e.name);
			json_stream->emit_json_key_value("mode", execution_model_to_str(e.execution_model));
			if (e.execution_model == ExecutionModelGLCompute)
			{
				const auto &spv_entry = get_entry_point(e.name, e.execution_model);

				SpecializationConstant spec_x, spec_y, spec_z;
				get_work_group_size_specialization_constants(spec_x, spec_y, spec_z);

				json_stream->emit_json_key_array("workgroup_size");
				json_stream->emit_json_array_value(spec_x.id != ID(0) ? spec_x.constant_id :
				                                                        spv_entry.workgroup_size.x);
				json_stream->emit_json_array_value(spec_y.id != ID(0) ? spec_y.constant_id :
				                                                        spv_entry.workgroup_size.y);
				json_stream->emit_json_array_value(spec_z.id != ID(0) ? spec_z.constant_id :
				                                                        spv_entry.workgroup_size.z);
				json_stream->end_json_array();

				json_stream->emit_json_key_array("workgroup_size_is_spec_constant_id");
				json_stream->emit_json_array_value(spec_x.id != ID(0));
				json_stream->emit_json_array_value(spec_y.id != ID(0));
				json_stream->emit_json_array_value(spec_z.id != ID(0));
				json_stream->end_json_array();
			}
			json_stream->end_json_object();
		}
		json_stream->end_json_array();
	}
}